

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_chain.cpp
# Opt level: O0

SampleInstance * __thiscall Prog::new_sample_instance(Prog *this)

{
  SampleInstance *this_00;
  size_type sVar1;
  Sample *in_RDI;
  uint n;
  SampleInstance *splinst;
  value_type *in_stack_ffffffffffffffb8;
  SampleInstance *in_stack_ffffffffffffffc0;
  SampleInstance *this_01;
  
  this_00 = (SampleInstance *)operator_new(0x38);
  SampleInstance::SampleInstance(this_00);
  this_01 = this_00;
  sVar1 = std::vector<const_Sample_*,_std::allocator<const_Sample_*>_>::size
                    ((vector<const_Sample_*,_std::allocator<const_Sample_*>_> *)
                     &in_RDI[2].filename.field_2);
  if (sVar1 != 0) {
    in_stack_ffffffffffffffb8 = (value_type *)(ulong)new_sample_instance::i;
    new_sample_instance::i = new_sample_instance::i + 1;
    sVar1 = std::vector<const_Sample_*,_std::allocator<const_Sample_*>_>::size
                      ((vector<const_Sample_*,_std::allocator<const_Sample_*>_> *)
                       &in_RDI[2].filename.field_2);
    in_stack_ffffffffffffffc0 = this_00;
    std::vector<const_Sample_*,_std::allocator<const_Sample_*>_>::operator[]
              ((vector<const_Sample_*,_std::allocator<const_Sample_*>_> *)
               &in_RDI[2].filename.field_2,(ulong)in_stack_ffffffffffffffb8 % sVar1 & 0xffffffff);
    SampleInstance::set_sample(this_01,in_RDI);
    new_sample_instance::i = new_sample_instance::i + 1;
  }
  std::vector<Element_*,_std::allocator<Element_*>_>::push_back
            ((vector<Element_*,_std::allocator<Element_*>_> *)in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8);
  return this_00;
}

Assistant:

SampleInstance *Prog::new_sample_instance()
{
   SampleInstance *splinst = new SampleInstance();
   if (samples.size() > 0) {
      static unsigned i = 0;
      unsigned n = (i++) % samples.size();
      splinst->set_sample(*samples[n]);
      i++;
   }
   elements.push_back(splinst);
   return splinst;
}